

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O3

bool __thiscall spvtools::utils::BitVector::Set(BitVector *this,uint32_t i)

{
  ulong uVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  value_type_conflict2 local_20;
  
  uVar4 = (ulong)(i >> 6);
  puVar2 = (this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= uVar4) {
    local_20 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->bits_,(ulong)((i >> 6) + 1),&local_20);
    puVar2 = (this->bits_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
  }
  uVar1 = puVar2[uVar4];
  uVar3 = 1L << (sbyte)(i & 0x3f);
  if ((uVar1 >> (i & 0x3f) & 1) == 0) {
    puVar2[uVar4] = uVar1 | uVar3;
  }
  return (uVar1 & uVar3) != 0;
}

Assistant:

bool Set(uint32_t i) {
    uint32_t element_index = i / kBitContainerSize;
    uint32_t bit_in_element = i % kBitContainerSize;

    if (element_index >= bits_.size()) {
      bits_.resize(element_index + 1, 0);
    }

    BitContainer original = bits_[element_index];
    BitContainer ith_bit = static_cast<BitContainer>(1) << bit_in_element;

    if ((original & ith_bit) != 0) {
      return true;
    } else {
      bits_[element_index] = original | ith_bit;
      return false;
    }
  }